

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setUniform
          (GLShaderProgram *this,string *name,vec2 val)

{
  bool bVar1;
  __type _Var2;
  invalid_argument *piVar3;
  long in_RDI;
  undefined1 in_XMM0 [16];
  GLShaderUniform *u;
  iterator __end2;
  iterator __begin2;
  vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>
  *__range2;
  vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>
  *in_stack_ffffffffffffff78;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>_>
  *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  reference in_stack_ffffffffffffffc8;
  __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>_>
  local_28;
  long local_20;
  undefined8 local_8;
  
  local_8 = vmovlpd_avx(in_XMM0);
  local_20 = in_RDI + 0x30;
  local_28._M_current =
       (GLShaderUniform *)
       std::
       vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>
       ::begin(in_stack_ffffffffffffff78);
  std::
  vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>
  ::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff80,
                       (__normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+((char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      std::invalid_argument::invalid_argument(piVar3,(string *)&stack0xffffffffffffff98);
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>_>
         ::operator*(&local_28);
    _Var2 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform_*,_std::vector<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>_>
    ::operator++(&local_28);
  }
  if (in_stack_ffffffffffffffc8->type == Vector2Float) {
    in_stack_ffffffffffffffc8->isSet = true;
    return;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"Tried to set GLShaderUniform with wrong type");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setUniform(std::string name, glm::vec2 val) {

  for (GLShaderUniform& u : uniforms) {
    if (u.name == name) {
      if (u.type == DataType::Vector2Float) {
        u.isSet = true;
      } else {
        throw std::invalid_argument("Tried to set GLShaderUniform with wrong type");
      }
      return;
    }
  }
  throw std::invalid_argument("Tried to set nonexistent uniform with name " + name);
}